

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TermSelectFinishMerge(Fts3Table *p,TermSelect *pTS)

{
  char *pcVar1;
  int iVar2;
  char *pcStack_40;
  int rc;
  char *aNew;
  int local_30;
  int nNew;
  int i;
  int nOut;
  char *aOut;
  TermSelect *pTS_local;
  Fts3Table *p_local;
  
  _i = (char *)0x0;
  nNew = 0;
  local_30 = 0;
  aOut = (char *)pTS;
  pTS_local = (TermSelect *)p;
  do {
    if (0xf < local_30) {
      *(char **)aOut = _i;
      *(int *)(aOut + 0x80) = nNew;
      return 0;
    }
    if (*(long *)(aOut + (long)local_30 * 8) != 0) {
      if (_i == (char *)0x0) {
        _i = *(char **)(aOut + (long)local_30 * 8);
        nNew = *(int *)(aOut + (long)local_30 * 4 + 0x80);
        pcVar1 = aOut + (long)local_30 * 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      else {
        iVar2 = fts3DoclistOrMerge((uint)*(byte *)((long)pTS_local[2].aaOutput + 0x47),
                                   *(char **)(aOut + (long)local_30 * 8),
                                   *(int *)(aOut + (long)local_30 * 4 + 0x80),_i,nNew,
                                   &stack0xffffffffffffffc0,(int *)((long)&aNew + 4));
        if (iVar2 != 0) {
          sqlite3_free(_i);
          return iVar2;
        }
        sqlite3_free(*(void **)(aOut + (long)local_30 * 8));
        sqlite3_free(_i);
        pcVar1 = aOut + (long)local_30 * 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        _i = pcStack_40;
        nNew = aNew._4_4_;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static int fts3TermSelectFinishMerge(Fts3Table *p, TermSelect *pTS){
  char *aOut = 0;
  int nOut = 0;
  int i;

  /* Loop through the doclists in the aaOutput[] array. Merge them all
  ** into a single doclist.
  */
  for(i=0; i<SizeofArray(pTS->aaOutput); i++){
    if( pTS->aaOutput[i] ){
      if( !aOut ){
        aOut = pTS->aaOutput[i];
        nOut = pTS->anOutput[i];
        pTS->aaOutput[i] = 0;
      }else{
        int nNew;
        char *aNew;

        int rc = fts3DoclistOrMerge(p->bDescIdx, 
            pTS->aaOutput[i], pTS->anOutput[i], aOut, nOut, &aNew, &nNew
        );
        if( rc!=SQLITE_OK ){
          sqlite3_free(aOut);
          return rc;
        }

        sqlite3_free(pTS->aaOutput[i]);
        sqlite3_free(aOut);
        pTS->aaOutput[i] = 0;
        aOut = aNew;
        nOut = nNew;
      }
    }
  }

  pTS->aaOutput[0] = aOut;
  pTS->anOutput[0] = nOut;
  return SQLITE_OK;
}